

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsChecker.cpp
# Opt level: O3

bool __thiscall DatUnpacker::ArgumentsChecker::check(ArgumentsChecker *this,Arguments *arguments)

{
  bool bVar1;
  
  if (arguments->format == UNKNOWN) {
    std::__cxx11::string::_M_replace
              ((ulong)this,0,(char *)(this->_errorMessage)._M_string_length,0x10a004);
  }
  else {
    bVar1 = checkSource(this,&arguments->source);
    if (bVar1) {
      bVar1 = checkDestination(this,&arguments->destination);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool ArgumentsChecker::check(const Arguments& arguments) {
        if (!checkFormat(arguments.format)) {
            return false;
        }

        if (!checkSource(arguments.source)) {
            return false;
        }

        if (!checkDestination(arguments.destination)) {
            return false;
        }

        return true;
    }